

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O0

unsigned_short
duckdb::AddOperatorOverflowCheck::Operation<unsigned_short,unsigned_short,unsigned_short>
          (unsigned_short left,unsigned_short right)

{
  bool bVar1;
  undefined8 uVar2;
  undefined2 in_SI;
  undefined2 in_DI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  OutOfRangeException *in_stack_00000010;
  PhysicalType in_stack_0000002f;
  unsigned_short result;
  undefined6 in_stack_ffffffffffffff38;
  unsigned_short in_stack_ffffffffffffff3e;
  uint16_t in_stack_ffffffffffffff44;
  uint16_t in_stack_ffffffffffffff46;
  allocator local_29;
  string local_28 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff8;
  unsigned_short in_stack_fffffffffffffffa;
  
  bVar1 = TryAddOperator::Operation<unsigned_short,unsigned_short,unsigned_short>
                    (in_stack_ffffffffffffff46,in_stack_ffffffffffffff44,
                     (uint16_t *)CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_28,"Overflow in addition of %s (%s + %s)!",&local_29);
    GetTypeId<unsigned_short>();
    TypeIdToString_abi_cxx11_(in_stack_0000002f);
    NumericHelper::ToString<unsigned_short>(in_stack_ffffffffffffff3e);
    NumericHelper::ToString<unsigned_short>(in_stack_ffffffffffffff3e);
    OutOfRangeException::
    OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_DI,CONCAT24(in_SI,CONCAT22(in_stack_fffffffffffffffa,
                                                      in_stack_fffffffffffffff8))),
               in_stack_fffffffffffffff0);
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  return in_stack_fffffffffffffffa;
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}